

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O2

void test_AString_split_multipleDelimiters_fn(int _i)

{
  int iVar1;
  ASplittedString *splitted;
  char *pcVar2;
  uint uVar3;
  char *pcVar4;
  char *expr;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  AString string;
  
  private_ACUtilsTest_AString_constructTestString(&string,";01;;23;",8);
  private_ACUtilsTest_AString_reallocFail = 0;
  splitted = AString_split(&string,';',false);
  if (string.capacity == 8) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa2a);
    if (string.buffer == (char *)0x0) {
      pcVar2 = (char *)0x0;
      pcVar7 = (char *)0x0;
      expr = "Assertion \'_ck_x != NULL\' failed";
      pcVar4 = "Assertion \'%s\' failed: %s == %#x";
      pcVar5 = "(void*) (string).buffer != NULL";
      pcVar6 = "(void*) (string).buffer";
    }
    else {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0xa2a);
      pcVar7 = string.buffer;
      if (string.buffer == (char *)0x0) {
        pcVar2 = "";
        pcVar7 = "(null)";
      }
      else {
        iVar1 = strcmp(";01;;23;",string.buffer);
        if (iVar1 == 0) {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0xa2a);
          if (string.size != 8) {
            pcVar7 = "strlen(\";01;;23;\")";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar5 = "(string).size == strlen(\";01;;23;\")";
            pcVar6 = "(string).size";
            pcVar2 = (char *)string.size;
            goto LAB_00151e83;
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0xa2a);
          if (splitted == (ASplittedString *)0x0) {
            pcVar2 = (char *)0x0;
            pcVar7 = (char *)0x0;
            expr = "Assertion \'_ck_x != NULL\' failed";
            pcVar4 = "Assertion \'%s\' failed: %s == %#x";
            pcVar5 = "(void*) splitted != NULL";
            pcVar6 = "(void*) splitted";
            iVar1 = 0xa2b;
            goto LAB_0015262d;
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0xa2b);
          pcVar2 = (char *)private_ACUtils_ADynArray_size(splitted);
          if (pcVar2 != (char *)0x5) {
            pcVar7 = "5";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar5 = "private_ACUtils_ADynArray_size(splitted) == 5";
            pcVar6 = "private_ACUtils_ADynArray_size(splitted)";
            iVar1 = 0xa2c;
            goto LAB_0015262d;
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0xa2c);
          pcVar2 = (char *)(*splitted->buffer)->capacity;
          if (pcVar2 == (char *)0x8) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0xa2d);
            if ((*splitted->buffer)->buffer == (char *)0x0) {
              pcVar2 = (char *)0x0;
              pcVar7 = (char *)0x0;
              expr = "Assertion \'_ck_x != NULL\' failed";
              pcVar4 = "Assertion \'%s\' failed: %s == %#x";
              pcVar5 = "(void*) (*(splitted->buffer[0])).buffer != NULL";
              pcVar6 = "(void*) (*(splitted->buffer[0])).buffer";
            }
            else {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0xa2d);
              pcVar7 = (*splitted->buffer)->buffer;
              if ((byte *)pcVar7 == (byte *)0x0) {
                pcVar7 = "(null)";
                pcVar2 = "";
              }
              else {
                if (*pcVar7 == 0) {
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0xa2d);
                  pcVar2 = (char *)(*splitted->buffer)->size;
                  if (pcVar2 != (char *)0x0) {
                    pcVar7 = "strlen(\"\")";
                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                    pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                    pcVar5 = "(*(splitted->buffer[0])).size == strlen(\"\")";
                    pcVar6 = "(*(splitted->buffer[0])).size";
                    goto LAB_0015202c;
                  }
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0xa2d);
                  pcVar2 = (char *)splitted->buffer[1]->capacity;
                  if (pcVar2 == (char *)0x8) {
                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0xa2e);
                    if (splitted->buffer[1]->buffer == (char *)0x0) {
                      pcVar2 = (char *)0x0;
                      pcVar7 = (char *)0x0;
                      expr = "Assertion \'_ck_x != NULL\' failed";
                      pcVar4 = "Assertion \'%s\' failed: %s == %#x";
                      pcVar5 = "(void*) (*(splitted->buffer[1])).buffer != NULL";
                      pcVar6 = "(void*) (*(splitted->buffer[1])).buffer";
                    }
                    else {
                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0xa2e);
                      pcVar7 = splitted->buffer[1]->buffer;
                      if ((byte *)pcVar7 == (byte *)0x0) {
                        pcVar2 = "";
                        pcVar7 = "(null)";
                      }
                      else {
                        uVar3 = (byte)*pcVar7 - 0x30;
                        if ((uVar3 == 0) && (uVar3 = ((byte *)pcVar7)[1] - 0x31, uVar3 == 0)) {
                          uVar3 = (uint)((byte *)pcVar7)[2];
                        }
                        if (uVar3 == 0) {
                          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0xa2e);
                          pcVar2 = (char *)splitted->buffer[1]->size;
                          if (pcVar2 != (char *)0x2) {
                            pcVar7 = "strlen(\"01\")";
                            expr = "Assertion \'_ck_x == _ck_y\' failed";
                            pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                            pcVar5 = "(*(splitted->buffer[1])).size == strlen(\"01\")";
                            pcVar6 = "(*(splitted->buffer[1])).size";
                            goto LAB_00152167;
                          }
                          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0xa2e);
                          pcVar2 = (char *)splitted->buffer[2]->capacity;
                          if (pcVar2 == (char *)0x8) {
                            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                        ,0xa2f);
                            if (splitted->buffer[2]->buffer == (char *)0x0) {
                              pcVar2 = (char *)0x0;
                              pcVar7 = (char *)0x0;
                              expr = "Assertion \'_ck_x != NULL\' failed";
                              pcVar4 = "Assertion \'%s\' failed: %s == %#x";
                              pcVar5 = "(void*) (*(splitted->buffer[2])).buffer != NULL";
                              pcVar6 = "(void*) (*(splitted->buffer[2])).buffer";
                            }
                            else {
                              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                          ,0xa2f);
                              pcVar7 = splitted->buffer[2]->buffer;
                              if ((byte *)pcVar7 == (byte *)0x0) {
                                pcVar7 = "(null)";
                                pcVar2 = "";
                              }
                              else {
                                if (*pcVar7 == 0) {
                                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                              ,0xa2f);
                                  pcVar2 = (char *)splitted->buffer[2]->size;
                                  if (pcVar2 != (char *)0x0) {
                                    pcVar7 = "strlen(\"\")";
                                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                                    pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                                    pcVar5 = "(*(splitted->buffer[2])).size == strlen(\"\")";
                                    pcVar6 = "(*(splitted->buffer[2])).size";
                                    goto LAB_00152290;
                                  }
                                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                              ,0xa2f);
                                  pcVar2 = (char *)splitted->buffer[3]->capacity;
                                  if (pcVar2 == (char *)0x8) {
                                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                ,0xa30);
                                    if (splitted->buffer[3]->buffer == (char *)0x0) {
                                      pcVar2 = (char *)0x0;
                                      pcVar7 = (char *)0x0;
                                      expr = "Assertion \'_ck_x != NULL\' failed";
                                      pcVar4 = "Assertion \'%s\' failed: %s == %#x";
                                      pcVar5 = "(void*) (*(splitted->buffer[3])).buffer != NULL";
                                      pcVar6 = "(void*) (*(splitted->buffer[3])).buffer";
                                    }
                                    else {
                                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0xa30);
                                      pcVar7 = splitted->buffer[3]->buffer;
                                      if ((byte *)pcVar7 == (byte *)0x0) {
                                        pcVar2 = "";
                                        pcVar7 = "(null)";
                                      }
                                      else {
                                        uVar3 = (byte)*pcVar7 - 0x32;
                                        if ((uVar3 == 0) &&
                                           (uVar3 = ((byte *)pcVar7)[1] - 0x33, uVar3 == 0)) {
                                          uVar3 = (uint)((byte *)pcVar7)[2];
                                        }
                                        if (uVar3 == 0) {
                                          _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0xa30);
                                          pcVar2 = (char *)splitted->buffer[3]->size;
                                          if (pcVar2 != (char *)0x2) {
                                            pcVar7 = "strlen(\"23\")";
                                            expr = "Assertion \'_ck_x == _ck_y\' failed";
                                            pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju"
                                            ;
                                            pcVar5 = 
                                            "(*(splitted->buffer[3])).size == strlen(\"23\")";
                                            pcVar6 = "(*(splitted->buffer[3])).size";
                                            goto LAB_001523cb;
                                          }
                                          _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0xa30);
                                          pcVar2 = (char *)splitted->buffer[4]->capacity;
                                          if (pcVar2 == (char *)0x8) {
                                            _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0xa31);
                                            if (splitted->buffer[4]->buffer == (char *)0x0) {
                                              pcVar2 = (char *)0x0;
                                              pcVar7 = (char *)0x0;
                                              expr = "Assertion \'_ck_x != NULL\' failed";
                                              pcVar4 = "Assertion \'%s\' failed: %s == %#x";
                                              pcVar5 = 
                                              "(void*) (*(splitted->buffer[4])).buffer != NULL";
                                              pcVar6 = "(void*) (*(splitted->buffer[4])).buffer";
                                            }
                                            else {
                                              _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0xa31);
                                              pcVar7 = splitted->buffer[4]->buffer;
                                              if ((byte *)pcVar7 == (byte *)0x0) {
                                                pcVar7 = "(null)";
                                                pcVar2 = "";
                                              }
                                              else {
                                                if (*pcVar7 == 0) {
                                                  _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0xa31);
                                                  pcVar2 = (char *)splitted->buffer[4]->size;
                                                  if (pcVar2 != (char *)0x0) {
                                                    pcVar7 = "strlen(\"\")";
                                                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                                                    pcVar4 = 
                                                  "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                                                  pcVar5 = 
                                                  "(*(splitted->buffer[4])).size == strlen(\"\")";
                                                  pcVar6 = "(*(splitted->buffer[4])).size";
                                                  goto LAB_001524f4;
                                                  }
                                                  _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0xa31);
                                                  AString_freeSplitted(splitted);
                                                  if (string.capacity == 8) {
                                                    _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0xa33);
                                                  if (string.buffer == (char *)0x0) {
                                                    pcVar2 = (char *)0x0;
                                                    pcVar7 = (char *)0x0;
                                                    expr = "Assertion \'_ck_x != NULL\' failed";
                                                    pcVar4 = "Assertion \'%s\' failed: %s == %#x";
                                                    pcVar5 = "(void*) (string).buffer != NULL";
                                                    pcVar6 = "(void*) (string).buffer";
                                                  }
                                                  else {
                                                    _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0xa33);
                                                  pcVar7 = string.buffer;
                                                  if (string.buffer == (char *)0x0) {
                                                    pcVar7 = "(null)";
                                                    pcVar2 = "";
                                                  }
                                                  else {
                                                    iVar1 = strcmp(";01;;23;",string.buffer);
                                                    if (iVar1 == 0) {
                                                      _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0xa33);
                                                  if (string.size == 8) {
                                                    _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0xa33);
                                                  if (private_ACUtilsTest_AString_reallocCount ==
                                                      private_ACUtilsTest_AString_freeCount) {
                                                    _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0xa34);
                                                  (*string.deallocator)(string.buffer);
                                                  return;
                                                  }
                                                  pcVar7 = "(private_ACUtilsTest_AString_freeCount)"
                                                  ;
                                                  expr = "Assertion \'_ck_x == _ck_y\' failed";
                                                  pcVar4 = 
                                                  "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                                                  pcVar5 = 
                                                  "private_ACUtilsTest_AString_reallocCount == (private_ACUtilsTest_AString_freeCount)"
                                                  ;
                                                  pcVar6 = 
                                                  "private_ACUtilsTest_AString_reallocCount";
                                                  iVar1 = 0xa34;
                                                  pcVar2 = (char *)
                                                  private_ACUtilsTest_AString_reallocCount;
                                                  goto LAB_0015262d;
                                                  }
                                                  pcVar7 = "strlen(\";01;;23;\")";
                                                  expr = "Assertion \'_ck_x == _ck_y\' failed";
                                                  pcVar4 = 
                                                  "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                                                  pcVar5 = "(string).size == strlen(\";01;;23;\")";
                                                  pcVar6 = "(string).size";
                                                  pcVar2 = (char *)string.size;
                                                  goto LAB_00152628;
                                                  }
                                                  pcVar2 = "\"";
                                                  }
                                                  expr = 
                                                  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                                                  ;
                                                  pcVar4 = 
                                                  "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s"
                                                  ;
                                                  pcVar5 = "(string).buffer == (\";01;;23;\")";
                                                  pcVar6 = "(string).buffer";
                                                  }
                                                  }
                                                  else {
                                                    pcVar7 = "(8)";
                                                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                                                    pcVar4 = 
                                                  "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                                                  pcVar5 = "(string).capacity == (8)";
                                                  pcVar6 = "(string).capacity";
                                                  pcVar2 = (char *)string.capacity;
                                                  }
LAB_00152628:
                                                  iVar1 = 0xa33;
                                                  goto LAB_0015262d;
                                                }
                                                pcVar2 = "\"";
                                              }
                                              expr = 
                                              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                                              ;
                                              pcVar4 = 
                                              "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
                                              pcVar5 = "(*(splitted->buffer[4])).buffer == (\"\")";
                                              pcVar6 = "(*(splitted->buffer[4])).buffer";
                                            }
                                          }
                                          else {
                                            pcVar7 = "(8)";
                                            expr = "Assertion \'_ck_x == _ck_y\' failed";
                                            pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju"
                                            ;
                                            pcVar5 = "(*(splitted->buffer[4])).capacity == (8)";
                                            pcVar6 = "(*(splitted->buffer[4])).capacity";
                                          }
LAB_001524f4:
                                          iVar1 = 0xa31;
                                          goto LAB_0015262d;
                                        }
                                        pcVar2 = "\"";
                                      }
                                      expr = 
                                      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                                      ;
                                      pcVar4 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s"
                                      ;
                                      pcVar5 = "(*(splitted->buffer[3])).buffer == (\"23\")";
                                      pcVar6 = "(*(splitted->buffer[3])).buffer";
                                    }
                                  }
                                  else {
                                    pcVar7 = "(8)";
                                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                                    pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                                    pcVar5 = "(*(splitted->buffer[3])).capacity == (8)";
                                    pcVar6 = "(*(splitted->buffer[3])).capacity";
                                  }
LAB_001523cb:
                                  iVar1 = 0xa30;
                                  goto LAB_0015262d;
                                }
                                pcVar2 = "\"";
                              }
                              expr = 
                              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                              ;
                              pcVar4 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
                              pcVar5 = "(*(splitted->buffer[2])).buffer == (\"\")";
                              pcVar6 = "(*(splitted->buffer[2])).buffer";
                            }
                          }
                          else {
                            pcVar7 = "(8)";
                            expr = "Assertion \'_ck_x == _ck_y\' failed";
                            pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                            pcVar5 = "(*(splitted->buffer[2])).capacity == (8)";
                            pcVar6 = "(*(splitted->buffer[2])).capacity";
                          }
LAB_00152290:
                          iVar1 = 0xa2f;
                          goto LAB_0015262d;
                        }
                        pcVar2 = "\"";
                      }
                      expr = 
                      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                      ;
                      pcVar4 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
                      pcVar5 = "(*(splitted->buffer[1])).buffer == (\"01\")";
                      pcVar6 = "(*(splitted->buffer[1])).buffer";
                    }
                  }
                  else {
                    pcVar7 = "(8)";
                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                    pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                    pcVar5 = "(*(splitted->buffer[1])).capacity == (8)";
                    pcVar6 = "(*(splitted->buffer[1])).capacity";
                  }
LAB_00152167:
                  iVar1 = 0xa2e;
                  goto LAB_0015262d;
                }
                pcVar2 = "\"";
              }
              expr = 
              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
              ;
              pcVar4 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
              pcVar5 = "(*(splitted->buffer[0])).buffer == (\"\")";
              pcVar6 = "(*(splitted->buffer[0])).buffer";
            }
          }
          else {
            pcVar7 = "(8)";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar5 = "(*(splitted->buffer[0])).capacity == (8)";
            pcVar6 = "(*(splitted->buffer[0])).capacity";
          }
LAB_0015202c:
          iVar1 = 0xa2d;
          goto LAB_0015262d;
        }
        pcVar2 = "\"";
      }
      expr = 
      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
      ;
      pcVar4 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
      pcVar5 = "(string).buffer == (\";01;;23;\")";
      pcVar6 = "(string).buffer";
    }
  }
  else {
    pcVar7 = "(8)";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar5 = "(string).capacity == (8)";
    pcVar6 = "(string).capacity";
    pcVar2 = (char *)string.capacity;
  }
LAB_00151e83:
  iVar1 = 0xa2a;
LAB_0015262d:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar1,expr,pcVar4,pcVar5,pcVar6,pcVar2,pcVar7);
}

Assistant:

END_TEST
START_TEST(test_AString_split_multipleDelimiters)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString(";01;;23;", 8);
    struct ASplittedString *splitted;
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    splitted = AString_split(&string, ';', false);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, ";01;;23;", 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(splitted);
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_size(splitted), 5);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*ADynArray_get(splitted, 0), "", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*ADynArray_get(splitted, 1), "01", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*ADynArray_get(splitted, 2), "", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*ADynArray_get(splitted, 3), "23", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*ADynArray_get(splitted, 4), "", 8);
    AString_freeSplitted(splitted);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, ";01;;23;", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(private_ACUtilsTest_AString_freeCount);
    private_ACUtilsTest_AString_destructTestString(string);
}